

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

__pid_t __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::wait(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
       *this,void *__stat_loc)

{
  _Rb_tree_node_base *p_Var1;
  __pid_t extraout_EAX;
  
  for (p_Var1 = (this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    reuse::work_thread::details::
    work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
    wait((work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
          *)p_Var1[1]._M_parent,__stat_loc);
  }
  stats::manually_registered_source_t::stop
            (&(this->m_data_source).super_manually_registered_source_t);
  return extraout_EAX;
}

Assistant:

virtual void
		wait() override
			{
				std::for_each(
					m_agent_threads.begin(),
					m_agent_threads.end(),
					call_wait< typename agent_thread_map_t::value_type > );

				m_data_source.stop();
			}